

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void a__GlPrintError(char *message,GLenum error)

{
  char *local_20;
  char *errstr;
  GLenum error_local;
  char *message_local;
  
  local_20 = "UNKNOWN";
  if (error == 0x500) {
    local_20 = "GL_INVALID_ENUM";
  }
  else if (error == 0x501) {
    local_20 = "GL_INVALID_VALUE";
  }
  else if (error == 0x502) {
    local_20 = "GL_INVALID_OPERATION";
  }
  else if (error == 0x503) {
    local_20 = "GL_STACK_OVERFLOW";
  }
  else if (error == 0x504) {
    local_20 = "GL_STACK_UNDERFLOW";
  }
  else if (error == 0x505) {
    local_20 = "GL_OUT_OF_MEMORY";
  }
  else if (error == 0x8031) {
    local_20 = "GL_TABLE_TOO_LARGE";
  }
  aAppDebugPrintf("[agl] %s %s (%#x)",message,local_20,(ulong)error);
  return;
}

Assistant:

static void a__GlPrintError(const char *message, GLenum error) {
	const char *errstr = "UNKNOWN";
	switch (error) {
	case GL_INVALID_ENUM: errstr = "GL_INVALID_ENUM"; break;
	case GL_INVALID_VALUE: errstr = "GL_INVALID_VALUE"; break;
	case GL_INVALID_OPERATION: errstr = "GL_INVALID_OPERATION"; break;
	#ifdef GL_STACK_OVERFLOW
	case GL_STACK_OVERFLOW: errstr = "GL_STACK_OVERFLOW"; break;
	#endif
	#ifdef GL_STACK_UNDERFLOW
	case GL_STACK_UNDERFLOW: errstr = "GL_STACK_UNDERFLOW"; break;
	#endif
	case GL_OUT_OF_MEMORY: errstr = "GL_OUT_OF_MEMORY"; break;
	#ifdef GL_TABLE_TOO_LARGE
	case GL_TABLE_TOO_LARGE: errstr = "GL_TABLE_TOO_LARGE"; break;
	#endif
	};
	AGL_PRINTFLN("%s %s (%#x)", message, errstr, error);
}